

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O3

void __thiscall Symbol::RestoreHasFuncAssignment(Symbol *this)

{
  code *pcVar1;
  bool bVar2;
  SymbolType SVar3;
  undefined4 *puVar4;
  
  SVar3 = this->symbolType;
  if (this->hasFuncAssignment != (SVar3 == STFunction)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0xaf,"(hasFuncAssignment == (this->symbolType == STFunction))",
                       "hasFuncAssignment == (this->symbolType == STFunction)");
    if (!bVar2) goto LAB_008a5837;
    *puVar4 = 0;
    SVar3 = this->symbolType;
  }
  if ((SVar3 != STFormal) && (this->hasMaybeEscapedUse == true)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0xb0,"(this->GetIsFormal() || !this->GetHasMaybeEscapedUse())",
                       "this->GetIsFormal() || !this->GetHasMaybeEscapedUse()");
    if (!bVar2) {
LAB_008a5837:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->hasFuncAssignment = true;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,StackFuncPhase);
  if (bVar2) {
    Output::Print(L"RestoreHasFuncAssignment: %s\n",(this->name).string.ptr);
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void Symbol::RestoreHasFuncAssignment()
{
    Assert(hasFuncAssignment == (this->symbolType == STFunction));
    Assert(this->GetIsFormal() || !this->GetHasMaybeEscapedUse());
    hasFuncAssignment = true;
    if (PHASE_TESTTRACE1(Js::StackFuncPhase))
    {
        Output::Print(_u("RestoreHasFuncAssignment: %s\n"), this->GetName().GetBuffer());
        Output::Flush();
    }
}